

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamToolsIndex_p.cpp
# Opt level: O1

void __thiscall
BamTools::Internal::BamToolsIndex::GetOffset
          (BamToolsIndex *this,BamRegion *region,int64_t *offset,bool *hasAlignmentsInRegion)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  BamException *this_00;
  int *piVar4;
  bool bVar5;
  ulong uVar6;
  difference_type __d;
  ulong uVar7;
  BtiReferenceEntry refEntry;
  string local_68;
  string local_48;
  
  iVar1 = region->LeftRefID;
  if ((iVar1 < 0) ||
     ((int)((ulong)((long)(this->m_indexFileSummary).
                          super__Vector_base<BamTools::Internal::BtiReferenceSummary,_std::allocator<BamTools::Internal::BtiReferenceSummary>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->m_indexFileSummary).
                         super__Vector_base<BamTools::Internal::BtiReferenceSummary,_std::allocator<BamTools::Internal::BtiReferenceSummary>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 4) <= iVar1)) {
    this_00 = (BamException *)__cxa_allocate_exception(0x28);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"BamToolsIndex::GetOffset","");
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"invalid region requested","");
    BamException::BamException(this_00,&local_68,&local_48);
    __cxa_throw(this_00,&BamException::typeinfo,BamException::~BamException);
  }
  local_68._M_dataplus._M_p._0_4_ = iVar1;
  local_68._M_string_length = 0;
  local_68.field_2._M_allocated_capacity = 0;
  local_68.field_2._8_8_ = 0;
  ReadReferenceEntry(this,(BtiReferenceEntry *)&local_68);
  piVar3 = (int *)local_68._M_string_length;
  piVar4 = (int *)local_68._M_string_length;
  if (0 < (long)(local_68.field_2._M_allocated_capacity - local_68._M_string_length)) {
    iVar1 = region->LeftPosition;
    iVar2 = region->RightPosition;
    uVar6 = (local_68.field_2._M_allocated_capacity - local_68._M_string_length >> 3) *
            -0x5555555555555555;
    do {
      uVar7 = uVar6 >> 1;
      piVar3 = piVar4 + uVar7 * 6;
      bVar5 = true;
      if (piVar3[4] <= iVar2) {
        if (iVar1 < *piVar3) {
          *offset = *(int64_t *)(piVar3 + 2);
          bVar5 = false;
          uVar7 = uVar6;
        }
        else {
          piVar3 = piVar3 + 6;
          uVar7 = uVar6 + ~uVar7;
          piVar4 = piVar3;
        }
      }
    } while ((bVar5) && (uVar6 = uVar7, 0 < (long)uVar7));
  }
  if (piVar3 == (int *)local_68.field_2._M_allocated_capacity) {
    bVar5 = false;
  }
  else {
    iVar1 = region->LeftPosition;
    bVar5 = false;
    do {
      if (piVar3 == piVar4) break;
      iVar2 = piVar3[-6];
      if (iVar2 <= iVar1) {
        *offset = *(int64_t *)(piVar3 + 2);
        bVar5 = true;
      }
      piVar3 = piVar3 + -6;
    } while (iVar1 < iVar2);
    if (piVar3 == piVar4) {
      *offset = *(int64_t *)(piVar3 + 2);
      bVar5 = true;
    }
  }
  *hasAlignmentsInRegion = bVar5;
  if ((int *)local_68._M_string_length != (int *)0x0) {
    operator_delete((void *)local_68._M_string_length);
  }
  return;
}

Assistant:

void BamToolsIndex::GetOffset(const BamRegion& region, int64_t& offset, bool* hasAlignmentsInRegion)
{

    // return false ref ID is not a valid index in file summary data
    if (region.LeftRefID < 0 || region.LeftRefID >= (int)m_indexFileSummary.size())
        throw BamException("BamToolsIndex::GetOffset", "invalid region requested");

    // retrieve reference index data for left bound reference
    BtiReferenceEntry refEntry(region.LeftRefID);
    ReadReferenceEntry(refEntry);

    // binary search for an overlapping block (may not be first one though)
    bool found = false;
    typedef BtiBlockVector::const_iterator BtiBlockConstIterator;
    BtiBlockConstIterator blockFirst = refEntry.Blocks.begin();
    BtiBlockConstIterator blockIter = blockFirst;
    BtiBlockConstIterator blockLast = refEntry.Blocks.end();
    std::iterator_traits<BtiBlockConstIterator>::difference_type count =
        std::distance(blockFirst, blockLast);
    std::iterator_traits<BtiBlockConstIterator>::difference_type step;
    while (count > 0) {
        blockIter = blockFirst;
        step = count / 2;
        advance(blockIter, step);

        const BtiBlock& block = (*blockIter);
        if (block.StartPosition <= region.RightPosition) {
            if (block.MaxEndPosition > region.LeftPosition) {
                offset = block.StartOffset;
                break;
            }
            blockFirst = ++blockIter;
            count -= step + 1;
        } else
            count = step;
    }

    // if we didn't search "off the end" of the blocks
    if (blockIter != blockLast) {

        // "walk back" until we've gone too far
        while (blockIter != blockFirst) {
            const BtiBlock& currentBlock = (*blockIter);

            --blockIter;
            const BtiBlock& previousBlock = (*blockIter);
            if (previousBlock.MaxEndPosition <= region.LeftPosition) {
                offset = currentBlock.StartOffset;
                found = true;
                break;
            }
        }

        // if we walked all the way to first block, just return that and let the reader's
        // region overlap parsing do the rest
        if (blockIter == blockFirst) {
            const BtiBlock& block = (*blockIter);
            offset = block.StartOffset;
            found = true;
        }
    }

    // sets to false if blocks container is empty, or if no matching block could be found
    *hasAlignmentsInRegion = found;
}